

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptRegExpConstructor.cpp
# Opt level: O3

void __thiscall
Js::JavascriptRegExpConstructor::SetLastMatch
          (JavascriptRegExpConstructor *this,RegexPattern *lastPattern,JavascriptString *lastInput,
          GroupInfo lastMatch)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  Type TVar4;
  undefined4 *puVar5;
  char *message;
  char *error;
  uint lineNumber;
  char *fileName;
  
  if (0xfffffffeffffffff < (ulong)lastMatch) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptRegExpConstructor.cpp"
                                ,0x30,"(!lastMatch.IsUndefined())",
                                "SetLastMatch should only be called if there\'s a successful match")
    ;
    if (!bVar2) goto LAB_00d029b1;
    *puVar5 = 0;
  }
  if (lastPattern == (RegexPattern *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptRegExpConstructor.cpp"
                                ,0x31,"(lastPattern != nullptr)","lastPattern should not be null");
    if (!bVar2) goto LAB_00d029b1;
    *puVar5 = 0;
  }
  if (lastInput == (JavascriptString *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptRegExpConstructor.cpp"
                                ,0x32,"(lastInput != nullptr)","lastInput should not be null");
    if (!bVar2) goto LAB_00d029b1;
    *puVar5 = 0;
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
    if (!bVar2) goto LAB_00d029b1;
    *puVar5 = 0;
    TVar4 = *_DAT_00000008;
    if ((int)TVar4 < 0x58) goto LAB_00d028cf;
    BVar3 = RecyclableObject::IsExternal((RecyclableObject *)0x0);
    if (BVar3 != 0) goto LAB_00d02967;
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    *puVar5 = 1;
LAB_00d0293c:
    fileName = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
    ;
    error = "(typeId < TypeIds_Limit || obj->IsExternal())";
    message = "GetTypeId aValue has invalid TypeId";
    lineNumber = 0xe;
  }
  else {
    TVar4 = ((lastInput->super_RecyclableObject).type.ptr)->typeId;
    if (0x57 < (int)TVar4) {
      BVar3 = RecyclableObject::IsExternal(&lastInput->super_RecyclableObject);
      if (BVar3 != 0) goto LAB_00d02967;
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      goto LAB_00d0293c;
    }
LAB_00d028cf:
    if (TVar4 != TypeIds_Null) goto LAB_00d02967;
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    fileName = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptRegExpConstructor.cpp"
    ;
    error = "(JavascriptOperators::GetTypeId(lastInput) != TypeIds_Null)";
    message = "lastInput should not be JavaScript null";
    lineNumber = 0x33;
  }
  bVar2 = Throw::ReportAssert(fileName,lineNumber,error,message);
  if (!bVar2) {
LAB_00d029b1:
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  *puVar5 = 0;
LAB_00d02967:
  Memory::Recycler::WBSetBit((char *)&this->lastPattern);
  (this->lastPattern).ptr = lastPattern;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->lastPattern);
  Memory::Recycler::WBSetBit((char *)&this->lastInput);
  (this->lastInput).ptr = lastInput;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->lastInput);
  (this->lastMatch).offset = lastMatch.offset;
  (this->lastMatch).length = lastMatch.length;
  this->invalidatedLastMatch = false;
  this->reset = true;
  return;
}

Assistant:

void JavascriptRegExpConstructor::SetLastMatch(UnifiedRegex::RegexPattern* lastPattern, JavascriptString* lastInput, UnifiedRegex::GroupInfo lastMatch)
    {
        AssertMsg(!lastMatch.IsUndefined(), "SetLastMatch should only be called if there's a successful match");
        AssertMsg(lastPattern != nullptr, "lastPattern should not be null");
        AssertMsg(lastInput != nullptr, "lastInput should not be null");
        AssertMsg(JavascriptOperators::GetTypeId(lastInput) != TypeIds_Null, "lastInput should not be JavaScript null");

        this->lastPattern = lastPattern;
        this->lastInput = lastInput;
        this->lastMatch = lastMatch;
        this->reset = true;
        this->invalidatedLastMatch = false;
    }